

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *
vkt::ubo::anon_unknown_0::allocateAndBindMemory
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          Context *context,VkBuffer buffer,MemoryRequirement memReqs)

{
  undefined8 uVar1;
  DeviceInterface *vk;
  VkDevice pVVar2;
  Allocator *pAVar3;
  Allocation *pAVar4;
  VkDeviceMemory VVar5;
  VkDeviceSize VVar6;
  undefined1 local_48 [8];
  VkMemoryRequirements bufReqs;
  DeviceInterface *vkd;
  Context *context_local;
  MemoryRequirement memReqs_local;
  VkBuffer buffer_local;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *memory;
  
  vk = Context::getDeviceInterface(context);
  bufReqs._16_8_ = vk;
  pVVar2 = Context::getDevice(context);
  ::vk::getBufferMemoryRequirements((VkMemoryRequirements *)local_48,vk,pVVar2,buffer);
  pAVar3 = Context::getDefaultAllocator(context);
  (*pAVar3->_vptr_Allocator[3])
            (__return_storage_ptr__,pAVar3,(VkMemoryRequirements *)local_48,(ulong)memReqs.m_flags);
  uVar1 = bufReqs._16_8_;
  pVVar2 = Context::getDevice(context);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&__return_storage_ptr__->
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar5 = ::vk::Allocation::getMemory(pAVar4);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&__return_storage_ptr__->
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar6 = ::vk::Allocation::getOffset(pAVar4);
  (**(code **)(*(long *)uVar1 + 0x60))(uVar1,pVVar2,buffer.m_internal,VVar5.m_internal,VVar6);
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<vk::Allocation> allocateAndBindMemory (Context& context, vk::VkBuffer buffer, vk::MemoryRequirement memReqs)
{
	const vk::DeviceInterface&		vkd		= context.getDeviceInterface();
	const vk::VkMemoryRequirements	bufReqs	= vk::getBufferMemoryRequirements(vkd, context.getDevice(), buffer);
	de::MovePtr<vk::Allocation>		memory	= context.getDefaultAllocator().allocate(bufReqs, memReqs);

	vkd.bindBufferMemory(context.getDevice(), buffer, memory->getMemory(), memory->getOffset());

	return memory;
}